

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_METAL_LABEL(Context *ctx)

{
  bool bVar1;
  RegisterList *pRVar2;
  uint uVar3;
  char *pcVar4;
  RegisterList *pRVar5;
  uint uVar6;
  size_t in_R8;
  char src0 [64];
  char acStack_48 [64];
  
  pRVar2 = (RegisterList *)
           make_METAL_srcarg_string(ctx,0,(ctx->dest_arg).writemask,acStack_48,in_R8);
  uVar3 = ctx->source_args[0].regnum | 0x120000;
  pRVar5 = (ctx->used_registers).next;
  do {
    if (pRVar5 == (RegisterList *)0x0) {
      pRVar2 = (RegisterList *)0x0;
      break;
    }
    uVar6 = pRVar5->regtype << 0x10 | pRVar5->regnum;
    if (uVar3 == uVar6) {
      bVar1 = false;
      pRVar2 = pRVar5;
    }
    else if (uVar3 < uVar6) {
      pRVar2 = (RegisterList *)0x0;
      bVar1 = false;
    }
    else {
      pRVar5 = pRVar5->next;
      bVar1 = true;
    }
  } while (bVar1);
  if (ctx->output != ctx->subroutines) {
    __assert_fail("ctx->output == ctx->subroutines",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1567,"void emit_METAL_LABEL(Context *)");
  }
  if (ctx->indent != 0) {
    __assert_fail("ctx->indent == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1568,"void emit_METAL_LABEL(Context *)");
  }
  if (pRVar2 == (RegisterList *)0x0) {
    set_output(ctx,&ctx->ignore);
    pcVar4 = "";
  }
  else {
    pcVar4 = "";
    if (pRVar2->misc == 1) {
      pcVar4 = "int aL";
    }
  }
  output_line(ctx,"static void %s(%s)",acStack_48,pcVar4);
  output_line(ctx,"{");
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_METAL_LABEL(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    const int label = ctx->source_args[0].regnum;
    RegisterList *reg = reglist_find(&ctx->used_registers, REG_TYPE_LABEL, label);
    assert(ctx->output == ctx->subroutines);  // not mainline, etc.
    assert(ctx->indent == 0);  // we shouldn't be in the middle of a function.

    // MSDN specs say CALL* has to come before the LABEL, so we know if we
    //  can ditch the entire function here as unused.
    if (reg == NULL)
        set_output(ctx, &ctx->ignore);  // Func not used. Parse, but don't output.

    // !!! FIXME: it would be nice if we could determine if a function is
    // !!! FIXME:  only called once and, if so, forcibly inline it.

    // !!! FIXME: this worked in GLSL because all our state is global to the shader,
    // !!! FIXME:  but in metal we kept it local to the shader mainline.
    // !!! FIXME:  Can we do C++11 lambdas in Metal to have nested functions?  :)

    const char *uses_loopreg = ((reg) && (reg->misc == 1)) ? "int aL" : "";
    output_line(ctx, "static void %s(%s)", src0, uses_loopreg);
    output_line(ctx, "{");
    ctx->indent++;
}